

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

SPxId __thiscall
soplex::SPxSteepPR<double>::selectEnterDenseDim(SPxSteepPR<double> *this,double *best,double tol)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  SPxSolverBase<double> *this_00;
  int end;
  int i;
  double x;
  double *coWeights_ptr;
  double *coTest;
  SPxId enterId;
  int i_00;
  DataKey local_8;
  
  SPxId::SPxId((SPxId *)0x2e7518);
  SPxSolverBase<double>::coTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  pdVar2 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e752e);
  pdVar3 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e754b);
  i_00 = 0;
  iVar1 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e7569);
  for (; i_00 < iVar1; i_00 = i_00 + 1) {
    if ((pdVar2[i_00] < -in_XMM0_Qa) &&
       (this_00 = (SPxSolverBase<double> *)
                  steeppr::computePrice<double>(pdVar2[i_00],pdVar3[i_00],in_XMM0_Qa),
       *in_RSI <= (double)this_00 && (double)this_00 != *in_RSI)) {
      *in_RSI = (double)this_00;
      local_8 = (DataKey)SPxSolverBase<double>::coId(this_00,i_00);
    }
  }
  return (SPxId)local_8;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterDenseDim(R& best, R tol)
{
   SPxId enterId;
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   R x;

   for(int i = 0, end = this->thesolver->dim(); i < end; ++i)
   {
      x = coTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            enterId = this->thesolver->coId(i);
         }
      }
   }

   return enterId;
}